

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

uint __thiscall ON_SubDEdge::DartCount(ON_SubDEdge *this)

{
  uint local_14;
  uint dart_count;
  ON_SubDEdge *this_local;
  
  local_14 = 0;
  if ((this->m_vertex[0] != (ON_SubDVertex *)0x0) && (this->m_vertex[0]->m_vertex_tag == Dart)) {
    local_14 = 1;
  }
  if ((this->m_vertex[1] != (ON_SubDVertex *)0x0) && (this->m_vertex[1]->m_vertex_tag == Dart)) {
    local_14 = local_14 + 1;
  }
  return local_14;
}

Assistant:

unsigned int ON_SubDEdge::DartCount() const
{
  unsigned int dart_count = 0;
  if (nullptr != m_vertex[0] && ON_SubDVertexTag::Dart == m_vertex[0]->m_vertex_tag)
    dart_count++;
  if (nullptr != m_vertex[1] && ON_SubDVertexTag::Dart == m_vertex[1]->m_vertex_tag)
    dart_count++;
  return dart_count;
}